

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn-state-machine.h
# Opt level: O3

void __thiscall cnn::RNNStateMachine::transition(RNNStateMachine *this,RNNOp op)

{
  RNNState RVar1;
  
  RVar1 = this->q_;
  if (RVar1 != READING_INPUT) {
    if (RVar1 != GRAPH_READY) {
      if (RVar1 != CREATED) {
        return;
      }
      if (op == new_graph) goto LAB_001670ea;
      failure(this,op);
    }
    if (op == new_graph) {
      return;
    }
    if (op == start_new_sequence) {
      this->q_ = READING_INPUT;
      return;
    }
    failure(this,op);
  }
  if (op - start_new_sequence < 2) {
    return;
  }
  if (op != new_graph) {
    failure(this,op);
    return;
  }
LAB_001670ea:
  this->q_ = GRAPH_READY;
  return;
}

Assistant:

void transition(RNNOp op) {
    switch (q_) {
      case RNNState::CREATED:
        if (op == RNNOp::new_graph) { q_ = RNNState::GRAPH_READY; break; }
        failure(op);
      case RNNState::GRAPH_READY:
        if (op == RNNOp::new_graph) { break; }
        if (op == RNNOp::start_new_sequence) { q_ = RNNState::READING_INPUT; break; }
        failure(op);
      case RNNState::READING_INPUT:
        if (op == RNNOp::add_input) { break; }
        if (op == RNNOp::start_new_sequence) { break; }
        if (op == RNNOp::new_graph) { q_ = RNNState::GRAPH_READY; break; }
        failure(op);
    }
  }